

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<std::complex<long_double>_>::ComputeWeights
          (TPZDohrSubstruct<std::complex<long_double>_> *this,
          TPZFMatrix<std::complex<long_double>_> *StiffnessDiag)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  pair<int,_int> *ppVar4;
  complex<long_double> *pcVar5;
  complex<long_double> *pcVar6;
  complex<long_double> *__z;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  complex<long_double> __r;
  complex<long_double> local_58;
  
  uVar2 = (uint)(this->fGlobalEqs).fNElements;
  uVar9 = 0;
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar8 = uVar9;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    ppVar4 = (this->fGlobalEqs).fStore;
    iVar3 = ppVar4[uVar9].first;
    pcVar5 = (this->fWeights).super_TPZVec<std::complex<long_double>_>.fStore;
    __z = TPZFMatrix<std::complex<long_double>_>::operator()
                    (StiffnessDiag,(long)ppVar4[uVar9].second,0);
    pcVar6 = pcVar5 + iVar3;
    local_58._M_value._0_8_ = *(undefined8 *)pcVar6->_M_value;
    local_58._M_value._8_8_ = *(undefined8 *)(pcVar6->_M_value + 8);
    puVar1 = (undefined8 *)(pcVar5[iVar3]._M_value + 0x10);
    local_58._M_value._16_8_ = *puVar1;
    local_58._M_value._24_8_ = puVar1[1];
    std::complex<long_double>::operator/=(&local_58,__z);
    pcVar5 = (this->fWeights).super_TPZVec<std::complex<long_double>_>.fStore;
    pcVar6 = pcVar5 + iVar3;
    *(undefined8 *)pcVar6->_M_value = local_58._M_value._0_8_;
    *(undefined8 *)(pcVar6->_M_value + 8) = local_58._M_value._8_8_;
    puVar1 = (undefined8 *)(pcVar5[iVar3]._M_value + 0x10);
    *puVar1 = local_58._M_value._16_8_;
    puVar1[1] = local_58._M_value._24_8_;
  }
  for (lVar7 = 0; lVar7 < (this->fInternalEqs).fNElements; lVar7 = lVar7 + 1) {
    iVar3 = (this->fInternalEqs).fStore[lVar7];
    pcVar6 = (this->fWeights).super_TPZVec<std::complex<long_double>_>.fStore;
    *(longdouble *)pcVar6[iVar3]._M_value = (longdouble)1;
    *(longdouble *)(pcVar6[iVar3]._M_value + 0x10) = (longdouble)0;
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ComputeWeights(TPZFMatrix<TVar> &StiffnessDiag) {
	int i;
	//fWeights.Fill(1.);
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		fWeights[ind.first] = fWeights[ind.first] / StiffnessDiag(ind.second,0);
	}
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		fWeights[fInternalEqs[i]] = 1.;
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Weights = " <<  fWeights;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
}